

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution_videos_worth_spreading.cpp
# Opt level: O0

void solve_videos_worth_spreading(void)

{
  Cache *cache_00;
  Video *video_00;
  bool bVar1;
  reference ppCVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  Video *video;
  int i;
  Cache *cache;
  int cache_id;
  
  for (cache._4_4_ = 0; cache._4_4_ < num_caches; cache._4_4_ = cache._4_4_ + 1) {
    ppCVar2 = std::vector<Cache_*,_std::allocator<Cache_*>_>::operator[](&caches,(long)cache._4_4_);
    cache_00 = *ppCVar2;
    compute(cache_00);
    for (video._4_4_ = 0;
        sVar3 = std::
                vector<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>::
                size(&sorted_aggregate_videos), (ulong)(long)video._4_4_ < sVar3;
        video._4_4_ = video._4_4_ + 1) {
      pvVar4 = std::vector<std::pair<double,_Video_*>,_std::allocator<std::pair<double,_Video_*>_>_>
               ::operator[](&sorted_aggregate_videos,(long)video._4_4_);
      video_00 = pvVar4->second;
      bVar1 = exists(cache_00,video_00);
      if ((bVar1) && (video_00->size <= cache_00->remaining)) {
        Cache::add_video(cache_00,video_00);
      }
    }
  }
  ppCVar2 = std::vector<Cache_*,_std::allocator<Cache_*>_>::operator[](&caches,0);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*ppCVar2)->remaining);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  ppCVar2 = std::vector<Cache_*,_std::allocator<Cache_*>_>::operator[](&caches,0);
  sVar3 = std::vector<Video_*,_std::allocator<Video_*>_>::size(&(*ppCVar2)->videos);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,sVar3);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void solve_videos_worth_spreading() {
    for (int cache_id = 0; cache_id < num_caches; ++cache_id) {
        Cache *cache = caches[cache_id];
        compute(cache);
        for (int i = 0; i < sorted_aggregate_videos.size(); ++i) {
            Video *video = sorted_aggregate_videos[i].second;
            if (exists(cache, video) && cache->remaining >= video->size) {
                cache->add_video(video);
            }
        }
    }

    cerr << caches[0]->remaining << endl;
    cerr << caches[0]->videos.size() << endl;
}